

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_feature.c
# Opt level: O0

void cmd_feature_help(void)

{
  printf(
        "Usage: feature [-f] <module> [<module>]*\n       feature -a [-f]\n                  Print features of all the modules with state of each one.\n\n  -f <module1, module2, ...>, --feature-param <module1, module2, ...>\n                  Generate features parameter for the command \"add\" \n                  in the form of -F <module-name>:<features>\n  -a, --all \n                  Print features of all implemented modules.\n"
        );
  return;
}

Assistant:

void
cmd_feature_help(void)
{
    printf("Usage: feature [-f] <module> [<module>]*\n"
            "       feature -a [-f]\n"
            "                  Print features of all the modules with state of each one.\n\n"
            "  -f <module1, module2, ...>, --feature-param <module1, module2, ...>\n"
            "                  Generate features parameter for the command \"add\" \n"
            "                  in the form of -F <module-name>:<features>\n"
            "  -a, --all \n"
            "                  Print features of all implemented modules.\n");
}